

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_StateDescriptor.cpp
# Opt level: O0

void __thiscall
amrex::StateDescriptor::cleanUpMaps
          (StateDescriptor *this,InterpBase ***maps,int **map_start_comp,int **map_num_comp,
          int **max_start_comp,int **min_end_comp)

{
  undefined8 *in_RCX;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  undefined8 *in_R8;
  undefined8 *in_R9;
  
  if ((void *)*in_RSI != (void *)0x0) {
    operator_delete__((void *)*in_RSI);
  }
  if ((void *)*in_RDX != (void *)0x0) {
    operator_delete__((void *)*in_RDX);
  }
  if ((void *)*in_RCX != (void *)0x0) {
    operator_delete__((void *)*in_RCX);
  }
  if ((void *)*in_R8 != (void *)0x0) {
    operator_delete__((void *)*in_R8);
  }
  if ((void *)*in_R9 != (void *)0x0) {
    operator_delete__((void *)*in_R9);
  }
  return;
}

Assistant:

void
StateDescriptor::cleanUpMaps (InterpBase**&   maps,
                              int*&           map_start_comp,
                              int*&           map_num_comp,
                              int*&           max_start_comp,
                              int*&           min_end_comp) const
{
    delete [] maps;
    delete [] map_start_comp;
    delete [] map_num_comp;
    delete [] max_start_comp;
    delete [] min_end_comp;
}